

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkFormatArguments(CheckerVisitor *this,CallExpr *call)

{
  bool bVar1;
  size_type_conflict sVar2;
  TreeOp TVar3;
  LiteralKind LVar4;
  ArenaVector<SQCompilation::Expr_*> *this_00;
  Node *this_01;
  LiteralExpr *pLVar5;
  CheckerVisitor *this_02;
  SQChar *pSVar6;
  Expr **ppEVar7;
  CallExpr *in_RSI;
  CheckerVisitor *in_RDI;
  SQChar *name;
  SQChar *s;
  int32_t formatsCount;
  Expr *arg;
  int32_t i;
  ArenaVector<SQCompilation::Expr_*> *arguments;
  Expr *in_stack_ffffffffffffffa8;
  CallExpr *in_stack_ffffffffffffffc0;
  int local_2c;
  uint local_1c;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    this_00 = CallExpr::arguments(in_RSI);
    for (local_1c = 0; sVar2 = ArenaVector<SQCompilation::Expr_*>::size(this_00), local_1c < sVar2;
        local_1c = local_1c + 1) {
      ArenaVector<SQCompilation::Expr_*>::operator[](this_00,local_1c);
      this_01 = &deparen(in_stack_ffffffffffffffa8)->super_Node;
      TVar3 = Node::op(this_01);
      if (TVar3 == TO_LITERAL) {
        pLVar5 = Expr::asLiteral((Expr *)this_01);
        LVar4 = LiteralExpr::kind(pLVar5);
        if (LVar4 == LK_STRING) {
          local_2c = 0;
          pLVar5 = Expr::asLiteral((Expr *)this_01);
          for (this_02 = (CheckerVisitor *)LiteralExpr::s(pLVar5);
              *(char *)&(this_02->super_Visitor)._vptr_Visitor != '\0';
              this_02 = (CheckerVisitor *)((long)&(this_02->super_Visitor)._vptr_Visitor + 1)) {
            if (*(char *)&(this_02->super_Visitor)._vptr_Visitor == '%') {
              if (*(char *)((long)&(this_02->super_Visitor)._vptr_Visitor + 1) == '%') {
                this_02 = (CheckerVisitor *)((long)&(this_02->super_Visitor)._vptr_Visitor + 1);
              }
              else {
                local_2c = local_2c + 1;
              }
            }
          }
          if (local_2c == 0) {
            return;
          }
          sVar2 = ArenaVector<SQCompilation::Expr_*>::size(this_00);
          if (local_2c == (sVar2 - local_1c) + -1) {
            return;
          }
          pSVar6 = extractFunctionName(this_02,in_stack_ffffffffffffffc0);
          if (pSVar6 == (SQChar *)0x0) {
            return;
          }
          bVar1 = nameLooksLikeFormatFunction(s);
          if (!bVar1) {
            return;
          }
          ppEVar7 = ArenaVector<SQCompilation::Expr_*>::operator[](this_00,local_1c);
          report(in_RDI,&(*ppEVar7)->super_Node,0x53);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkFormatArguments(const CallExpr *call) {
  if (effectsOnly)
    return;

  const auto &arguments = call->arguments();

  for (int32_t i = 0; i < arguments.size(); ++i) {
    const Expr *arg = deparen(arguments[i]);
    if (arg->op() == TO_LITERAL && arg->asLiteral()->kind() == LK_STRING) { // -V522
      int32_t formatsCount = 0;
      for (const SQChar *s = arg->asLiteral()->s(); *s; ++s) {
        if (*s == '%') {
          if (*(s + 1) == '%') {
            s++;
          }
          else {
            formatsCount++;
          }
        }
      }

      if (formatsCount && formatsCount != (arguments.size() - i - 1)) {
        const SQChar *name = extractFunctionName(call);
        if (!name)
          return;

        if (nameLooksLikeFormatFunction(name)) {
          report(arguments[i], DiagnosticsId::DI_FORMAT_ARGUMENTS_COUNT);
        }
      }

      return;
    }
  }
}